

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O2

bool axl::io::getSymbolicLinkTarget(String *targetName,StringRef *linkName)

{
  int iVar1;
  C *pCVar2;
  C *__buf;
  ssize_t sVar3;
  size_t length;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_d0;
  stat linkStat;
  
  memset(&linkStat,0,0x90);
  pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(linkName);
  iVar1 = lstat(pCVar2,(stat *)&linkStat);
  if (iVar1 != -1) {
    if ((linkStat.st_mode & 0xf000) != 0xa000) {
      err::ErrorRef::ErrorRef((ErrorRef *)&local_d0,0x16);
      err::setError((ErrorRef *)&local_d0);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_d0);
      return false;
    }
    length = 0x1000;
    if (linkStat.st_size != 0) {
      length = linkStat.st_size;
    }
    __buf = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                      (targetName,length,false);
    if (__buf == (C *)0x0) {
      return false;
    }
    pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(linkName);
    sVar3 = readlink(pCVar2,__buf,length);
    if ((int)sVar3 != -1) {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::overrideLength
                (targetName,(long)(int)sVar3);
      return true;
    }
  }
  err::setLastSystemError();
  return false;
}

Assistant:

bool
getSymbolicLinkTarget(
	sl::String* targetName,
	const sl::StringRef& linkName
) {
	struct stat linkStat = { 0 };

	int result = ::lstat(linkName.sz(), &linkStat);
	if (result == -1)
		return err::failWithLastSystemError();

	if (!S_ISLNK(linkStat.st_mode))
		return err::fail(EINVAL);

	size_t bufferLength = linkStat.st_size ? linkStat.st_size : PATH_MAX;

	char* p = targetName->createBuffer(bufferLength);
	if (!p)
		return false;

	result = readlink(linkName.sz(), p, bufferLength);
	if (result == -1)
		return err::failWithLastSystemError();

	ASSERT(result <= bufferLength);
	targetName->overrideLength(result);
	return true;
}